

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ref.h
# Opt level: O0

Pointer<anurbs::NurbsCurveGeometry<3L>_> __thiscall
anurbs::Ref<anurbs::NurbsCurveGeometry<3L>_>::data(Ref<anurbs::NurbsCurveGeometry<3L>_> *this)

{
  __shared_ptr_access<anurbs::Entry<anurbs::NurbsCurveGeometry<3L>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_RSI;
  shared_ptr<anurbs::NurbsCurveGeometry<3L>_> sVar1;
  Pointer<anurbs::NurbsCurveGeometry<3L>_> PVar2;
  Ref<anurbs::NurbsCurveGeometry<3L>_> *this_local;
  
  std::
  __shared_ptr_access<anurbs::Entry<anurbs::NurbsCurveGeometry<3L>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->(in_RSI);
  sVar1 = Entry<anurbs::NurbsCurveGeometry<3L>_>::data
                    ((Entry<anurbs::NurbsCurveGeometry<3L>_> *)this);
  PVar2.super___shared_ptr<anurbs::NurbsCurveGeometry<3L>,_(__gnu_cxx::_Lock_policy)2>._M_refcount =
       sVar1.super___shared_ptr<anurbs::NurbsCurveGeometry<3L>,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  PVar2.super___shared_ptr<anurbs::NurbsCurveGeometry<3L>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Pointer<anurbs::NurbsCurveGeometry<3L>_>)
         PVar2.super___shared_ptr<anurbs::NurbsCurveGeometry<3L>,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Pointer<TData> data() const
    {
        return m_entry->data();
    }